

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  RepeatedField<int> *pRVar2;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar3;
  LogMessage *pLVar4;
  CppType *pCVar5;
  CppType *pCVar6;
  bool *v1_00;
  bool *v2_00;
  LogMessage local_d8;
  Voidify local_c1;
  Nullable<const_char_*> local_c0;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_a1;
  CppType local_a0;
  CppType local_9c;
  Nullable<const_char_*> local_98;
  LogMessage local_90;
  Voidify local_79;
  anon_enum_32 local_78;
  anon_enum_32 local_74;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  CppType local_40;
  CppType local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  bool local_16;
  FieldType local_15;
  int value_local;
  bool packed_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._4_4_ = value;
  local_16 = packed;
  local_15 = type;
  value_local = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,(Extension **)&absl_log_internal_check_op_result)
  ;
  if (bVar1) {
    absl_log_internal_check_op_result[8] = local_15;
    local_3c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_3c);
    local_40 = CPPTYPE_ENUM;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM")
    ;
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x230,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    absl_log_internal_check_op_result[9] = '\x01';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
    absl_log_internal_check_op_result[0xb] = local_16 & 1;
    pRVar2 = Arena::Create<google::protobuf::RepeatedField<int>>(this->arena_);
    *(RepeatedField<int> **)absl_log_internal_check_op_result = pRVar2;
  }
  else {
    local_74 = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_74);
    local_78 = REPEATED_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_78);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x237,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    local_9c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_9c);
    local_a0 = CPPTYPE_ENUM;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a0);
    local_98 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    if (local_98 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x237,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&absl_log_internal_check_op_result_2);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
    }
    v1_00 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>
                      ((bool *)(absl_log_internal_check_op_result + 0xb));
    v2_00 = absl::lts_20250127::log_internal::GetReferenceableValue<bool>(&local_16);
    local_c0 = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                         (v1_00,v2_00,"extension->is_packed == packed");
    if (local_c0 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_c0);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x238,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_c1,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_d8);
    }
    local_c0 = (Nullable<const_char_*>)0x0;
  }
  RepeatedField<int>::Add
            (*(RepeatedField<int> **)absl_log_internal_check_op_result,descriptor_local._4_4_);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}